

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInteger.cpp
# Opt level: O0

int __thiscall BigIntegerLibrary::BigInteger::compare(BigInteger *this,BigInteger *other)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  int local_28;
  int local_24;
  int i;
  int sign;
  BigInteger *other_local;
  BigInteger *this_local;
  
  local_24 = 1;
  if (((this->isNegative & 1U) != 0) && ((other->isNegative & 1U) != 0)) {
    local_24 = -1;
  }
  if (((this->isNegative & 1U) == 0) || ((other->isNegative & 1U) != 0)) {
    if (((other->isNegative & 1U) == 0) || ((this->isNegative & 1U) != 0)) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->num);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&other->num);
      if (sVar3 < sVar2) {
        this_local._4_4_ = local_24;
      }
      else {
        sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->num);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&other->num);
        if (sVar2 < sVar3) {
          this_local._4_4_ = -local_24;
        }
        else {
          sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->num);
          local_28 = (int)sVar2;
          do {
            local_28 = local_28 + -1;
            if (local_28 < 0) {
              return 0;
            }
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->num,(long)local_28);
            iVar1 = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&other->num,(long)local_28);
            if (*pvVar4 < iVar1) {
              return local_24;
            }
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->num,(long)local_28);
            iVar1 = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&other->num,(long)local_28);
          } while (*pvVar4 <= iVar1);
          this_local._4_4_ = -local_24;
        }
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int BigInteger::compare(const BigInteger& other) const {
        int sign = 1;
        if (isNegative && other.isNegative) {
            sign = -1;
        }
        if (isNegative && !other.isNegative) { // a < b
            return -1;
        }
        if (other.isNegative && !isNegative) { // a > b
            return 1;
        }
        if (num.size() > other.num.size()) { // a > b
            return sign;
        }
        if (num.size() < other.num.size()) { // a < b
            return -sign;
        }
        for (int i = (int) num.size() - 1; i >= 0; --i) {
            if (num[i] > other.num[i]) { // a > b
                return sign;
            }
            if (num[i] < other.num[i]) { // a < b
                return -sign;
            }
        }
        return 0; // a == b
    }